

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

int bio_fwrite_3d(void ***arr,size_t e_sz,uint32 d1,uint32 d2,uint32 d3,FILE *fp,uint32 *chksum)

{
  int32 iVar1;
  int iVar2;
  char *fmt;
  long ln;
  uint32 d3_local;
  uint32 d2_local;
  uint32 d1_local;
  
  d3_local = d3;
  d2_local = d2;
  d1_local = d1;
  iVar1 = bio_fwrite(&d1_local,4,1,fp,0,chksum);
  if (iVar1 == 1) {
    iVar1 = bio_fwrite(&d2_local,4,1,fp,0,chksum);
    if (iVar1 == 1) {
      iVar1 = bio_fwrite(&d3_local,4,1,fp,0,chksum);
      if (iVar1 == 1) {
        iVar2 = bio_fwrite_1d(**arr,e_sz,d2_local * d1_local * d3_local,fp,chksum);
        return iVar2;
      }
      if (iVar1 == 0) {
        fmt = "Unable to write complete data";
        ln = 0x221;
      }
      else {
        fmt = "OS error in bio_fwrite_3d";
        ln = 0x224;
      }
    }
    else if (iVar1 == 0) {
      fmt = "Unable to write complete data";
      ln = 0x215;
    }
    else {
      fmt = "OS error in bio_fwrite_3d";
      ln = 0x218;
    }
  }
  else if (iVar1 == 0) {
    fmt = "Unable to write complete data";
    ln = 0x209;
  }
  else {
    fmt = "OS error in bio_fwrite_3d";
    ln = 0x20c;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                 ,ln,fmt);
  return -1;
}

Assistant:

int
bio_fwrite_3d(void ***arr,
	   size_t e_sz,
	   uint32 d1,
	   uint32 d2,
	   uint32 d3,
	   FILE *fp,
	   uint32 *chksum)
{
    size_t ret;

    /* write out first dimension 1 */
    ret = bio_fwrite(&d1, sizeof(uint32), 1, fp, 0, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to write complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fwrite_3d");
	}
	return -1;
    }

    /* write out first dimension 2 */
    ret = bio_fwrite(&d2, sizeof(uint32), 1, fp, 0, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to write complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fwrite_3d");
	}
	return -1;
    }

    /* write out first dimension 3 */
    ret = bio_fwrite(&d3, sizeof(uint32), 1, fp, 0, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to write complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fwrite_3d");
	}
	return -1;
    }

    /* write out the data in the array as one big block */
    return bio_fwrite_1d(arr[0][0], e_sz, d1 * d2 * d3, fp, chksum);
}